

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O3

bool re2::RE2::Arg::parse_uint_radix(char *str,int n,void *dest,int radix)

{
  bool bVar1;
  unsigned_long r;
  ulong local_10;
  
  bVar1 = parse_ulong_radix(str,n,&local_10,radix);
  if ((bVar1) && (local_10 >> 0x20 == 0)) {
    bVar1 = true;
    if (dest != (void *)0x0) {
      *(int *)dest = (int)local_10;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool RE2::Arg::parse_uint_radix(const char* str,
                               int n,
                               void* dest,
                               int radix) {
  unsigned long r;
  if (!parse_ulong_radix(str, n, &r, radix)) return false; // Could not parse
  if ((uint)r != r) return false;                       // Out of range
  if (dest == NULL) return true;
  *(reinterpret_cast<unsigned int*>(dest)) = r;
  return true;
}